

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O0

void __thiscall AdsDevice::AdsDevice(AdsDevice *this,string *ipV4,AmsNetId netId,uint16_t port)

{
  char *ip;
  AmsNetId *__p;
  pointer __p_00;
  long lVar1;
  function<long_(long)> local_c8;
  ResourceDeleter<const_long> local_a8;
  anon_class_1_0_00000001 local_71;
  function<long_(AmsNetId)> local_70;
  ResourceDeleter<const_AmsNetId> local_50;
  uint local_30;
  uint local_2c;
  uint local_28;
  undefined2 local_24;
  uint16_t local_22;
  string *psStack_20;
  uint16_t port_local;
  string *ipV4_local;
  AdsDevice *this_local;
  AmsNetId netId_local;
  
  local_28 = netId.b._0_4_;
  local_24 = netId.b._4_2_;
  local_22 = port;
  psStack_20 = ipV4;
  ipV4_local = (string *)this;
  this_local._2_4_ = local_28;
  this_local._6_2_ = local_24;
  ip = (char *)std::__cxx11::string::c_str();
  local_2c = CONCAT22(local_2c._2_2_,local_24);
  local_30 = local_28;
  __p = AddRoute((AmsNetId)((uint6)local_28 | (uint6)local_2c << 0x20),ip);
  std::function<long(AmsNetId)>::
  function<AdsDevice::AdsDevice(std::__cxx11::string_const&,AmsNetId,unsigned_short)::__0,void>
            ((function<long(AmsNetId)> *)&local_70,&local_71);
  ResourceDeleter<const_AmsNetId>::ResourceDeleter(&local_50,&local_70);
  std::unique_ptr<AmsNetId_const,ResourceDeleter<AmsNetId_const>>::
  unique_ptr<ResourceDeleter<AmsNetId_const>,void>
            ((unique_ptr<AmsNetId_const,ResourceDeleter<AmsNetId_const>> *)this,__p,&local_50);
  ResourceDeleter<const_AmsNetId>::~ResourceDeleter(&local_50);
  std::function<long_(AmsNetId)>::~function(&local_70);
  *(undefined2 *)((this->m_Addr).netId.b + 4) = this_local._6_2_;
  *(uint *)(this->m_Addr).netId.b = this_local._2_4_;
  (this->m_Addr).port = local_22;
  __p_00 = (pointer)operator_new(8);
  lVar1 = AdsPortOpenEx();
  *__p_00 = lVar1;
  std::function<long(long)>::function<long(&)(long),void>
            ((function<long(long)> *)&local_c8,AdsPortCloseEx);
  ResourceDeleter<const_long>::ResourceDeleter(&local_a8,&local_c8);
  std::unique_ptr<long_const,ResourceDeleter<long_const>>::
  unique_ptr<ResourceDeleter<long_const>,void>
            ((unique_ptr<long_const,ResourceDeleter<long_const>> *)&this->m_LocalPort,__p_00,
             &local_a8);
  ResourceDeleter<const_long>::~ResourceDeleter(&local_a8);
  std::function<long_(long)>::~function(&local_c8);
  return;
}

Assistant:

AdsDevice::AdsDevice(const std::string& ipV4, AmsNetId netId, uint16_t port)
    : m_NetId(AddRoute(netId, ipV4.c_str()), {[](AmsNetId ams){bhf::ads::DelLocalRoute(ams); return 0; }}),
    m_Addr({netId, port}),
    m_LocalPort(new long { AdsPortOpenEx() }, {AdsPortCloseEx})
{}